

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

bool GUINewFrame(HGUI handle,vector<GUIComponent,_std::allocator<GUIComponent>_> *gui_components,
                vector<GUITexture,_std::allocator<GUITexture>_> *textures)

{
  float fVar1;
  float fVar2;
  float fVar3;
  pointer pGVar4;
  int iVar5;
  uint32_t uVar6;
  iterator __begin1;
  pointer pGVar7;
  int *widths_00;
  float *pfVar8;
  float *pfVar9;
  int iVar10;
  EGUIComponentType type;
  mu_Context *pmVar11;
  int items;
  int i;
  uint uVar12;
  ulong uVar13;
  float fVar14;
  mu_Rect mVar15;
  undefined1 local_94;
  undefined1 local_90;
  int empty_width [1];
  int widths [4];
  int column_widths [2];
  
  pGVar7 = (gui_components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)._M_impl
           .super__Vector_impl_data._M_start;
  pGVar4 = (gui_components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  if ((pGVar7 != pGVar4) ||
     ((textures->super__Vector_base<GUITexture,_std::allocator<GUITexture>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (textures->super__Vector_base<GUITexture,_std::allocator<GUITexture>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    iVar10 = 0;
    for (; pGVar7 != pGVar4; pGVar7 = pGVar7 + 1) {
      iVar10 = iVar10 + (uint)pGVar7->IsInUse;
    }
    if ((iVar10 != 0) ||
       ((textures->super__Vector_base<GUITexture,_std::allocator<GUITexture>_>)._M_impl.
        super__Vector_impl_data._M_start !=
        (textures->super__Vector_base<GUITexture,_std::allocator<GUITexture>_>)._M_impl.
        super__Vector_impl_data._M_finish)) {
      empty_width[0] = -1;
      mu_begin(*(mu_Context **)((long)handle + 0x10));
      pmVar11 = *(mu_Context **)((long)handle + 0x10);
      mVar15 = mu_rect(0,0,300,*(int *)((long)handle + 0x1a0c9c));
      iVar10 = mu_begin_window_ex(pmVar11,"",mVar15,0x2080);
      if (iVar10 != 0) {
        if (*(long *)((long)handle + 0x1a0cb0) == 0) {
          fVar14 = (float)*(int *)(*(long *)(*(long *)((long)handle + 0x10) + 0x78) + 0x10) * -0.5;
          iVar10 = (int)(fVar14 + 37.5);
          iVar5 = (int)(fVar14 + 30.0);
          pGVar7 = (gui_components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          pGVar4 = (gui_components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
          pfVar8 = pGVar7->Data;
          for (; pGVar7 != pGVar4; pGVar7 = pGVar7 + 1) {
            if (pGVar7->IsInUse == true) {
              column_widths[0] = 0x96;
              column_widths[1] = 0x87;
              mu_layout_row(*(mu_Context **)((long)handle + 0x10),2,column_widths,0);
              mu_layout_begin_column(*(mu_Context **)((long)handle + 0x10));
              type = pGVar7->Type;
              items = 1;
              switch(type) {
              case EGUIComponentTypeSlider1:
                pmVar11 = *(mu_Context **)((long)handle + 0x10);
                widths_00 = empty_width;
                goto LAB_001153e5;
              case EGUIComponentTypeSlider2:
                widths[1] = -1;
                widths[0] = (int)(fVar14 + 75.0);
                pmVar11 = *(mu_Context **)((long)handle + 0x10);
                items = 2;
                break;
              case EGUIComponentTypeSlider3:
                widths[1] = (int)(fVar14 + 50.0);
                widths[0] = (int)(fVar14 + 50.0);
                widths[2] = -1;
                pmVar11 = *(mu_Context **)((long)handle + 0x10);
                items = 3;
                break;
              case EGUIComponentTypeSlider4:
              case EGUIComponentTypeColor3:
                widths[1] = iVar10;
                widths[0] = iVar10;
                widths[3] = -1;
                widths[2] = iVar10;
                pmVar11 = *(mu_Context **)((long)handle + 0x10);
                items = 4;
                break;
              case EGUIComponentTypeColor4:
                widths[1] = iVar5;
                widths[0] = iVar5;
                widths[3] = iVar5;
                widths[2] = iVar5;
                pmVar11 = *(mu_Context **)((long)handle + 0x10);
                items = 5;
                break;
              default:
                goto switchD_0011536d_default;
              }
              widths_00 = widths;
LAB_001153e5:
              mu_layout_row(pmVar11,items,widths_00,0);
              type = pGVar7->Type;
              if (type < EGUIComponentTypeColor3) {
                pfVar9 = pfVar8;
                for (uVar13 = 0; uVar6 = GUIComponents(type), uVar13 < uVar6; uVar13 = uVar13 + 1) {
                  mu_slider_ex(*(mu_Context **)((long)handle + 0x10),pfVar9,
                               (pGVar7->field_4).SliderRange.Start,(pGVar7->field_4).SliderRange.End
                               ,0.01,"%.2f",1);
                  type = pGVar7->Type;
                  pfVar9 = pfVar9 + 1;
                }
              }
              else {
switchD_0011536d_default:
                pfVar9 = pfVar8;
                for (uVar13 = 0; uVar6 = GUIComponents(type), uVar13 < uVar6; uVar13 = uVar13 + 1) {
                  *pfVar9 = *pfVar9 * 255.0;
                  mu_slider_ex(*(mu_Context **)((long)handle + 0x10),pfVar9,0.0,255.0,0.0,"%.0f",1);
                  *pfVar9 = *pfVar9 / 255.0;
                  type = pGVar7->Type;
                  pfVar9 = pfVar9 + 1;
                }
                fVar1 = pGVar7->Data[0];
                fVar2 = pGVar7->Data[1];
                fVar3 = pGVar7->Data[2];
                uVar6 = GUIComponents(pGVar7->Type);
                uVar12 = 0xff000000;
                if (uVar6 == 4) {
                  uVar12 = (int)(pGVar7->Data[3] * 255.0) << 0x18;
                }
                pmVar11 = *(mu_Context **)((long)handle + 0x10);
                mVar15 = mu_layout_next(pmVar11);
                local_94 = (undefined1)(int)(fVar2 * 255.0);
                local_90 = (undefined1)(int)(fVar1 * 255.0);
                mu_draw_rect(pmVar11,mVar15,
                             (mu_Color)
                             ((uint)CONCAT11(local_94,local_90) |
                             ((int)(fVar3 * 255.0) & 0xffU) << 0x10 | uVar12));
              }
              mu_layout_end_column(*(mu_Context **)((long)handle + 0x10));
              mu_layout_begin_column(*(mu_Context **)((long)handle + 0x10));
              mu_layout_row(*(mu_Context **)((long)handle + 0x10),1,empty_width,0);
              mu_label(*(mu_Context **)((long)handle + 0x10),(pGVar7->UniformName)._M_dataplus._M_p)
              ;
              mu_layout_end_column(*(mu_Context **)((long)handle + 0x10));
            }
            pfVar8 = pfVar8 + 0x12;
          }
        }
        else {
          mu_layout_row(*(mu_Context **)((long)handle + 0x10),1,empty_width,-1);
          mu_begin_panel_ex(*(mu_Context **)((long)handle + 0x10),"Log Output",0);
          mu_get_current_container(*(mu_Context **)((long)handle + 0x10));
          mu_layout_row(*(mu_Context **)((long)handle + 0x10),1,empty_width,-1);
          mu_text(*(mu_Context **)((long)handle + 0x10),*(char **)((long)handle + 0x1a0ca8));
          mu_end_panel(*(mu_Context **)((long)handle + 0x10));
        }
        mu_end_window(*(mu_Context **)((long)handle + 0x10));
      }
      mu_end(*(mu_Context **)((long)handle + 0x10));
      return true;
    }
  }
  return false;
}

Assistant:

bool GUINewFrame(HGUI handle, std::vector<GUIComponent>& gui_components, std::vector<GUITexture> textures) {
    if (gui_components.empty() && textures.empty()) {
        return false;
    }

    uint32_t components_in_use = 0;
    for (const GUIComponent& component : gui_components) {
        if (component.IsInUse)
            ++components_in_use;
    }

    if (components_in_use == 0 && textures.empty()) {
        return false;
    }

    GUI* gui = (GUI*)handle;
    int window_w = 300;
    int empty_width[1] = {-1};

    mu_begin(gui->Ctx);
    if (mu_begin_window_ex(gui->Ctx, "", mu_rect(0, 0, window_w, gui->Height), MU_OPT_NOTITLE | MU_OPT_FORCE_RESIZE)) {
        if (!gui->Log.empty()) {
            mu_layout_row(gui->Ctx, 1, empty_width, -1);
            mu_begin_panel(gui->Ctx, "Log Output");
            mu_Container* panel = mu_get_current_container(gui->Ctx);

            mu_layout_row(gui->Ctx, 1, empty_width, -1);
            mu_text(gui->Ctx, gui->Log.c_str());
            mu_end_panel(gui->Ctx);
        } else {
            int label_text_w = 150;

            int column_1_w = (int)(window_w * 0.5f);
            int column_2_w = (int)(window_w * 0.5f) - 15;

            int component_1_w = window_w - label_text_w;
            int component_2_w = (component_1_w / 2.0f) - gui->Ctx->style->padding * 0.5f;
            int component_3_w = (component_1_w / 3.0f) - gui->Ctx->style->padding * 0.5f;
            int component_4_w = (component_1_w / 4.0f) - gui->Ctx->style->padding * 0.5f;
            int component_5_w = (component_1_w / 5.0f) - gui->Ctx->style->padding * 0.5f;

            for (GUIComponent& component : gui_components) {
                if (!component.IsInUse) {
                    continue;
                }

                int column_widths[2] = {column_1_w, column_2_w};
                mu_layout_row(gui->Ctx, 2, column_widths, 0);
                mu_layout_begin_column(gui->Ctx);
                switch (component.Type) {
                    case EGUIComponentTypeSlider1: {
                        mu_layout_row(gui->Ctx, 1, empty_width, 0);
                        break;
                    }
                    case EGUIComponentTypeSlider2: {
                        int widths[2] = { component_2_w, -1 };
                        mu_layout_row(gui->Ctx, 2, widths, 0);
                        break;
                    }
                    case EGUIComponentTypeSlider3: {
                        int widths[3] = { component_3_w, component_3_w, -1 };
                        mu_layout_row(gui->Ctx, 3, widths, 0);
                        break;
                    }
                    case EGUIComponentTypeColor3:
                    case EGUIComponentTypeSlider4: {
                        int widths[4] = { component_4_w, component_4_w, component_4_w, -1 };
                        mu_layout_row(gui->Ctx, 4, widths, 0);
                        break;
                    }
                    case EGUIComponentTypeColor4: {
                        int widths[5] = { component_5_w, component_5_w, component_5_w, component_5_w, -1 };
                        mu_layout_row(gui->Ctx, 5, widths, 0);
                        break;
                    }
                }

                if (GUIIsSliderType(component.Type)) {
                    for (int i = 0; i < GUIComponents(component.Type); ++i) {
                        mu_slider_ex(gui->Ctx, &component.Data[i], component.SliderRange.Start, component.SliderRange.End, 0.01f, "%.2f", MU_OPT_ALIGNCENTER);
                    }
                } else {
                    for (int i = 0; i < GUIComponents(component.Type); ++i) {
                        component.Data[i] *= 255.0f;
                        mu_slider_ex(gui->Ctx, &component.Data[i], 0.0, 255.0f, 0, "%.0f", MU_OPT_ALIGNCENTER);
                        component.Data[i] /= 255.0f;
                    }
                    
                    mu_Color color;
                    color.r = (uint8_t)(component.Data[0] * 255.0f);
                    color.g = (uint8_t)(component.Data[1] * 255.0f);
                    color.b = (uint8_t)(component.Data[2] * 255.0f);
                    color.a = GUIComponents(component.Type) == 4 ? (uint8_t)(component.Data[3] * 255.0f) : 255;
                    mu_draw_rect(gui->Ctx, mu_layout_next(gui->Ctx), color);
                }
                mu_layout_end_column(gui->Ctx);

                mu_layout_begin_column(gui->Ctx);
                mu_layout_row(gui->Ctx, 1, empty_width, 0);
                mu_label(gui->Ctx, component.UniformName.c_str());
                mu_layout_end_column(gui->Ctx);
            }
        }
#if 0
        for (const auto& texture : textures) {
            float aspect = (float)texture.Width / (float)texture.Height;
            float max_width = ImGui::GetContentRegionAvailWidth();
            float height = max_width / aspect;

            ImGui::Image(texture.Id, ImVec2(max_width, height), ImVec2(0, 1), ImVec2(1, 0));
        }
#endif
        mu_end_window(gui->Ctx);
    }
    mu_end(gui->Ctx);

    return true;
}